

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

int mp_read_int8(char **data,int8_t *ret)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong uVar5;
  
  pbVar3 = (byte *)*data;
  bVar1 = *pbVar3;
  uVar5 = (ulong)bVar1;
  switch(bVar1) {
  case 0xcc:
    uVar5 = (ulong)pbVar3[1];
    pbVar4 = pbVar3 + 2;
    break;
  case 0xcd:
    pbVar4 = pbVar3 + 3;
    uVar5 = (ulong)(ushort)(*(ushort *)(pbVar3 + 1) << 8 | *(ushort *)(pbVar3 + 1) >> 8);
    break;
  case 0xce:
    uVar2 = *(uint *)(pbVar3 + 1);
    uVar5 = (ulong)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18)
    ;
    pbVar4 = pbVar3 + 5;
    break;
  case 0xcf:
    uVar5 = *(ulong *)(pbVar3 + 1);
    uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    pbVar4 = pbVar3 + 9;
    break;
  case 0xd0:
    uVar5 = (ulong)pbVar3[1];
    pbVar4 = pbVar3 + 2;
    goto LAB_00105bb0;
  case 0xd1:
    pbVar4 = pbVar3 + 3;
    uVar5 = (ulong)(short)(*(ushort *)(pbVar3 + 1) << 8 | *(ushort *)(pbVar3 + 1) >> 8);
    goto LAB_00105b9d;
  case 0xd2:
    uVar2 = *(uint *)(pbVar3 + 1);
    pbVar4 = pbVar3 + 5;
    uVar5 = (ulong)(int)(uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18);
    goto LAB_00105b9d;
  case 0xd3:
    uVar5 = *(ulong *)(pbVar3 + 1);
    uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    pbVar4 = pbVar3 + 9;
LAB_00105b9d:
    if ((long)(char)uVar5 != uVar5) {
      return -1;
    }
    goto LAB_00105bb0;
  default:
    if ((char)bVar1 < -0x20) {
      return -1;
    }
    pbVar4 = pbVar3 + 1;
    goto LAB_00105bb0;
  }
  if (0x7f < uVar5) {
    return -1;
  }
LAB_00105bb0:
  *ret = (int8_t)uVar5;
  *data = (char *)pbVar4;
  return 0;
}

Assistant:

MP_IMPL int
mp_read_int8(const char **data, int8_t *ret)
{
	int64_t ival;
	uint64_t uval;
	const char *p = *data;
	uint8_t c = mp_load_u8(&p);
	switch (c) {
	case 0xd0:
		*ret = (int8_t)mp_load_u8(&p);
		goto commit;
	case 0xd1:
		ival = (int16_t)mp_load_u16(&p);
		goto handle_signed;
	case 0xd2:
		ival = (int32_t)mp_load_u32(&p);
		goto handle_signed;
	case 0xd3:
		ival = (int64_t)mp_load_u64(&p);
		goto handle_signed;
	case 0xcc:
		uval = mp_load_u8(&p);
		goto handle_unsigned;
	case 0xcd:
		uval = mp_load_u16(&p);
		goto handle_unsigned;
	case 0xce:
		uval = mp_load_u32(&p);
		goto handle_unsigned;
	case 0xcf:
		uval = mp_load_u64(&p);
		goto handle_unsigned;
	default:
		if (mp_unlikely(c < 0xe0 && c > 0x7f))
			return -1;
		*ret = (int8_t) c;
		goto commit;
	}
handle_signed:
	if (mp_unlikely(ival > INT8_MAX || ival < INT8_MIN))
		return -1;
	*ret = (int8_t)ival;
	goto commit;
handle_unsigned:
	if (mp_unlikely(uval > INT8_MAX))
		return -1;
	*ret = (int8_t)uval;
	goto commit;
commit:
	*data = p;
	return 0;
}